

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

Variable __thiscall LiteScript::CreateVariable(LiteScript *this,Memory *memory,char *value)

{
  Object *this_00;
  String *this_01;
  uint *extraout_RDX;
  Variable VVar1;
  String local_48;
  undefined1 local_21;
  char *local_20;
  char *value_local;
  Memory *memory_local;
  Variable *v;
  
  local_21 = 0;
  local_20 = value;
  value_local = (char *)memory;
  memory_local = (Memory *)this;
  Memory::Create((Memory *)this,(Type *)memory);
  String::String(&local_48,local_20);
  this_00 = Variable::operator->((Variable *)this);
  this_01 = Object::GetData<LiteScript::String>(this_00);
  String::operator=(this_01,&local_48);
  String::~String(&local_48);
  VVar1.nb_ref = extraout_RDX;
  VVar1.obj = (Object *)this;
  return VVar1;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, const char *value) {
    Variable v = memory.Create(Type::STRING);
    v->GetData<String>() = String(value);
    return v;
}